

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O0

ZSTD_CCtx * ZSTD_createCCtx_advanced(ZSTD_customMem customMem)

{
  ZSTD_customMem customMem_00;
  ZSTD_customMem memManager;
  size_t in_stack_00000008;
  long in_stack_00000010;
  ZSTD_CCtx *cctx;
  undefined8 in_stack_ffffffffffffffe0;
  undefined8 *puVar1;
  void *in_stack_fffffffffffffff0;
  ZSTD_CCtx *local_8;
  
  puVar1 = &stack0x00000008;
  if ((in_stack_00000008 == 0) == (in_stack_00000010 == 0)) {
    customMem_00.customFree = (ZSTD_freeFunction)puVar1;
    customMem_00.customAlloc = (ZSTD_allocFunction)in_stack_ffffffffffffffe0;
    customMem_00.opaque = in_stack_fffffffffffffff0;
    local_8 = (ZSTD_CCtx *)ZSTD_customMalloc(in_stack_00000008,customMem_00);
    if (local_8 == (ZSTD_CCtx *)0x0) {
      local_8 = (ZSTD_CCtx *)0x0;
    }
    else {
      memManager.customFree = (ZSTD_freeFunction)puVar1;
      memManager.customAlloc = (ZSTD_allocFunction)in_stack_ffffffffffffffe0;
      memManager.opaque = local_8;
      ZSTD_initCCtx((ZSTD_CCtx *)puVar1[1],memManager);
    }
  }
  else {
    local_8 = (ZSTD_CCtx *)0x0;
  }
  return local_8;
}

Assistant:

ZSTD_CCtx* ZSTD_createCCtx_advanced(ZSTD_customMem customMem)
{
    ZSTD_STATIC_ASSERT(zcss_init==0);
    ZSTD_STATIC_ASSERT(ZSTD_CONTENTSIZE_UNKNOWN==(0ULL - 1));
    if ((!customMem.customAlloc) ^ (!customMem.customFree)) return NULL;
    {   ZSTD_CCtx* const cctx = (ZSTD_CCtx*)ZSTD_customMalloc(sizeof(ZSTD_CCtx), customMem);
        if (!cctx) return NULL;
        ZSTD_initCCtx(cctx, customMem);
        return cctx;
    }
}